

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHarnessHandlers.cpp
# Opt level: O2

void __thiscall
XMLHarnessHandlers::XMLHarnessHandlers(XMLHarnessHandlers *this,XMLCh *baseURL,XMLCh *scanner)

{
  RefVectorOf<xercesc_4_0::XMLURL> *this_00;
  SAX2XMLReader *pSVar1;
  XMLURL *this_01;
  BaseErrorHandler *this_02;
  
  BaseHarnessHandlers::BaseHarnessHandlers(&this->super_BaseHarnessHandlers,baseURL);
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_EntityResolver._vptr_EntityResolver =
       (_func_int **)&PTR__XMLHarnessHandlers_0010ea00;
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_DTDHandler._vptr_DTDHandler =
       (_func_int **)&PTR__XMLHarnessHandlers_0010eb18;
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_ContentHandler._vptr_ContentHandler =
       (_func_int **)&PTR__XMLHarnessHandlers_0010eb50;
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_ErrorHandler._vptr_ErrorHandler =
       (_func_int **)&PTR__XMLHarnessHandlers_0010ebc8;
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_LexicalHandler._vptr_LexicalHandler =
       (_func_int **)&PTR__XMLHarnessHandlers_0010ec08;
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_DeclHandler._vptr_DeclHandler =
       (_func_int **)&PTR__XMLHarnessHandlers_0010ec60;
  this_02 = &this->fErrorHandler;
  BaseErrorHandler::BaseErrorHandler(this_02);
  this_00 = &(this->fTestBaseURL).fVector;
  xercesc_4_0::RefVectorOf<xercesc_4_0::XMLURL>::RefVectorOf
            (this_00,5,true,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pSVar1 = (SAX2XMLReader *)
           xercesc_4_0::XMLReaderFactory::createXMLReader
                     (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,(XMLGrammarPool *)0x0);
  this->fParser = pSVar1;
  (*pSVar1->_vptr_SAX2XMLReader[0xd])(pSVar1,&xercesc_4_0::XMLUni::fgXercesScannerName,scanner);
  (*this->fParser->_vptr_SAX2XMLReader[0xc])
            (this->fParser,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,1);
  (*this->fParser->_vptr_SAX2XMLReader[0xc])(this->fParser,&xercesc_4_0::XMLUni::fgXercesDynamic,0);
  (*this->fParser->_vptr_SAX2XMLReader[0xb])();
  this_01 = (XMLURL *)xercesc_4_0::XMemory::operator_new((XMemory *)0x58,(ulong)this_02);
  xercesc_4_0::XMLURL::XMLURL(this_01,&(this->super_BaseHarnessHandlers).fBaseURL);
  xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XMLURL>::addElement
            (&this_00->super_BaseRefVectorOf<xercesc_4_0::XMLURL>,this_01);
  return;
}

Assistant:

XMLHarnessHandlers::XMLHarnessHandlers(const XMLCh* baseURL, const XMLCh* scanner) : BaseHarnessHandlers(baseURL)
, fTestBaseURL(5)
{
    fParser = XMLReaderFactory::createXMLReader();
    fParser->setProperty(XMLUni::fgXercesScannerName, (void*)scanner);
    fParser->setFeature(XMLUni::fgSAX2CoreValidation, true);
    fParser->setFeature(XMLUni::fgXercesDynamic, false);
    fParser->setErrorHandler(&fErrorHandler);
    
    fTestBaseURL.push(new XMLURL(fBaseURL));
}